

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int key_type_s(BinarySource *src)

{
  int iVar1;
  int toret;
  BinarySource *src_local;
  
  iVar1 = key_type_s_internal(src);
  BinarySource_REWIND_TO__(src->binarysource_,0);
  return iVar1;
}

Assistant:

int key_type_s(BinarySource *src)
{
    int toret = key_type_s_internal(src);
    BinarySource_REWIND(src);
    return toret;
}